

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cereal.hpp
# Opt level: O0

void __thiscall
cereal::InputArchive<cereal::JSONInputArchive,0u>::process<std::vector<int,std::allocator<int>>&>
          (InputArchive<cereal::JSONInputArchive,0u> *this,vector<int,_std::allocator<int>_> *head)

{
  vector<int,_std::allocator<int>_> *head_local;
  InputArchive<cereal::JSONInputArchive,_0U> *this_local;
  
  prologue<std::vector<int,_std::allocator<int>_>,_(cereal::traits::detail::sfinae)0>
            (*(JSONInputArchive **)(this + 0x20),head);
  InputArchive<cereal::JSONInputArchive,_0U>::
  processImpl<std::vector<int,_std::allocator<int>_>,_(cereal::traits::detail::sfinae)0>
            (*(InputArchive<cereal::JSONInputArchive,_0U> **)(this + 0x20),head);
  epilogue<std::vector<int,_std::allocator<int>_>,_(cereal::traits::detail::sfinae)0>
            (*(JSONInputArchive **)(this + 0x20),head);
  return;
}

Assistant:

inline
      void process( T && head )
      {
        prologue( *self, head );
        self->processImpl( head );
        epilogue( *self, head );
      }